

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::RenderBuffer::RenderBuffer
          (RenderBuffer *this,RenderBufferType type_,uint sizeX_,uint sizeY_)

{
  runtime_error *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__RenderBuffer_007948b8;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  if ((*(uint *)((long)in_RDI + 0xc) < 0x400001) && (*(uint *)(in_RDI + 2) < 0x400001)) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"OpenGL error: invalid renderbuffer dimensions");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RenderBuffer::RenderBuffer(RenderBufferType type_, unsigned int sizeX_, unsigned int sizeY_)
    : type(type_), sizeX(sizeX_), sizeY(sizeY_) {
  if (sizeX > (1 << 22) || sizeY > (1 << 22)) throw std::runtime_error("OpenGL error: invalid renderbuffer dimensions");
}